

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_struct_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,size_t size,uint16_t align)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  undefined6 in_register_0000008a;
  
  uVar3 = CONCAT62(in_register_0000008a,align) & 0xffffffff;
  iVar2 = flatcc_verify_vector_field(td,id,required,uVar3,1,0xffffffff);
  if (iVar2 != 0) {
    iVar2 = flatcc_verify_vector_field(td,id,required,uVar3,1,0xffffffff);
    return iVar2;
  }
  uVar1 = id * 2 + 4;
  if ((uVar1 < td->vsize) &&
     (uVar3 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar1), uVar3 != 0)) {
    puVar4 = (uint *)((long)td->buf +
                     (ulong)*(uint *)((long)td->buf + uVar3 + td->table) + uVar3 + td->table);
    iVar2 = flatcc_verify_struct_as_root(puVar4 + 1,(ulong)*puVar4,fid,size,align);
    return iVar2;
  }
  return 0;
}

Assistant:

int flatcc_verify_struct_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid, size_t size, uint16_t align)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    return flatcc_verify_struct_as_root(buf, bufsiz, fid, size, align);
}